

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void traverse_itree_no_recurse<PredictionData<double,unsigned_long>,unsigned_long>
               (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
               PredictionData<double,_unsigned_long> *prediction_data,double *output_depth,
               unsigned_long *tree_num,double *tree_depth,size_t row)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  double *in_RCX;
  long *in_RDX;
  long in_RSI;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_RDI;
  long in_R8;
  double *in_R9;
  long in_stack_00000008;
  int cval;
  double xval;
  size_t curr_lev;
  vector<signed_char,_std::allocator<signed_char>_> *local_e0;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffff30;
  vector<signed_char,_std::allocator<signed_char>_> *local_c8;
  vector<signed_char,_std::allocator<signed_char>_> *local_b8;
  int local_ac;
  vector<signed_char,_std::allocator<signed_char>_> *local_a0;
  vector<signed_char,_std::allocator<signed_char>_> *local_98;
  long local_80;
  vector<signed_char,_std::allocator<signed_char>_> *local_70;
  long local_58;
  vector<signed_char,_std::allocator<signed_char>_> *local_38;
  
  local_38 = (vector<signed_char,_std::allocator<signed_char>_> *)0x0;
  while (pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            (in_RDI,(size_type)local_38), pvVar4->tree_left != 0) {
    pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,(size_type)local_38);
    local_80 = in_stack_00000008;
    if (pvVar4->col_type == Numeric) {
      lVar2 = *in_RDX;
      if ((*(byte *)(in_RDX + 3) & 1) == 0) {
        pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)local_38);
        local_58 = pvVar4->col_num + in_stack_00000008 * in_RDX[4];
      }
      else {
        pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)local_38);
        local_58 = local_80 + pvVar4->col_num * in_RDX[2];
      }
      dVar1 = *(double *)(lVar2 + local_58 * 8);
      pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         (in_RDI,(size_type)local_38);
      if (pvVar4->num_split < dVar1) {
        pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)local_38);
        local_70 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_right;
      }
      else {
        pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)local_38);
        local_70 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_left;
      }
      local_38 = local_70;
    }
    else if (pvVar4->col_type == Categorical) {
      lVar2 = in_RDX[1];
      if ((*(byte *)(in_RDX + 3) & 1) == 0) {
        pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)local_38);
        local_80 = pvVar4->col_num + in_stack_00000008 * in_RDX[5];
      }
      else {
        pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)local_38);
        local_80 = local_80 + pvVar4->col_num * in_RDX[2];
      }
      local_ac = *(int *)(lVar2 + local_80 * 4);
      if (*(int *)(in_RSI + 0x1c) == 0) {
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,(size_type)local_38);
        bVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::empty
                          (in_stack_ffffffffffffff30);
        if (bVar3) {
          if (local_ac < 2) {
            if (local_ac == 0) {
              pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)local_38);
              local_98 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_left;
            }
            else {
              pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)local_38);
              local_98 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_right;
            }
            local_38 = local_98;
          }
          else {
            pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)local_38);
            if (0.5 < pvVar4->pct_tree_left || pvVar4->pct_tree_left == 0.5) {
              pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)local_38);
              local_a0 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_right;
            }
            else {
              pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)local_38);
              local_a0 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_left;
            }
            local_38 = local_a0;
          }
        }
        else if (*(int *)(in_RSI + 0x18) == 0xb) {
          pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)local_38);
          sVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar4->cat_split);
          if (local_ac < (int)sVar5) {
            pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)local_38);
            pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               (&pvVar4->cat_split,(long)local_ac);
            if (*pvVar6 == '\0') {
              pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)local_38);
              in_stack_ffffffffffffff30 =
                   (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_right;
              local_38 = in_stack_ffffffffffffff30;
            }
            else {
              pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)local_38);
              in_stack_ffffffffffffff30 =
                   (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_left;
              local_38 = in_stack_ffffffffffffff30;
            }
          }
          else {
            pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)local_38);
            if (0.5 < pvVar4->pct_tree_left || pvVar4->pct_tree_left == 0.5) {
              pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)local_38);
              local_c8 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_right;
            }
            else {
              pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)local_38);
              local_c8 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_left;
            }
            local_38 = local_c8;
          }
        }
        else if (*(int *)(in_RSI + 0x18) == 0xc) {
          pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)local_38);
          sVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar4->cat_split);
          if ((int)sVar5 <= local_ac) {
            pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)local_38);
            sVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar4->cat_split)
            ;
            local_ac = local_ac % (int)sVar5;
          }
          pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)local_38);
          pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             (&pvVar4->cat_split,(long)local_ac);
          if (*pvVar6 == '\0') {
            pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)local_38);
            local_b8 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_right;
          }
          else {
            pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)local_38);
            local_b8 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_left;
          }
          local_38 = local_b8;
        }
      }
      else if (*(int *)(in_RSI + 0x1c) == 0x29) {
        pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)local_38);
        if (local_ac == pvVar4->chosen_cat) {
          pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)local_38);
          local_e0 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_left;
        }
        else {
          pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)local_38);
          local_e0 = (vector<signed_char,_std::allocator<signed_char>_> *)pvVar4->tree_right;
        }
        local_38 = local_e0;
      }
    }
  }
  pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,(size_type)local_38);
  *in_RCX = pvVar4->score + *in_RCX;
  if (in_R8 != 0) {
    *(vector<signed_char,_std::allocator<signed_char>_> **)(in_R8 + in_stack_00000008 * 8) =
         local_38;
  }
  if (in_R9 != (double *)0x0) {
    pvVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,(size_type)local_38);
    *in_R9 = pvVar4->score;
  }
  return;
}

Assistant:

void traverse_itree_no_recurse(std::vector<IsoTree>  &tree,
                               IsoForest             &model_outputs,
                               PredictionData        &prediction_data,
                               double &restrict      output_depth,
                               sparse_ix *restrict   tree_num,
                               double *restrict      tree_depth,
                               size_t                row) noexcept
{
    size_t curr_lev = 0;
    double xval;
    int    cval;
    while (true)
    {
        // if (tree[curr_lev].score > 0)
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            output_depth += tree[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            break;
        }

        else
        {
            switch (tree[curr_lev].col_type)
            {
                case Numeric:
                {
                    xval =  prediction_data.numeric_data[
                                prediction_data.is_col_major?
                                (row + tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_numeric)
                            ];
                    curr_lev = (xval <= tree[curr_lev].num_split)?
                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                    break;
                }

                case Categorical:
                {
                    cval =  prediction_data.categ_data[
                                prediction_data.is_col_major?
                                (row +  tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_categ)
                            ];
                    switch (model_outputs.cat_split_type)
                    {
                        case SubSet:
                        {

                            if (tree[curr_lev].cat_split.empty()) /* this is for binary columns */
                            {
                                if (cval <= 1)
                                {
                                    curr_lev = (cval == 0)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                }

                                else /* can only work with 'Smallest' + no NAs if reaching this point */
                                {
                                    curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                }
                            }

                            else
                            {

                                switch (model_outputs.new_cat_action)
                                {
                                    case Random:
                                    {
                                        cval = (cval >= (int)tree[curr_lev].cat_split.size())?
                                                (cval % (int)tree[curr_lev].cat_split.size()) : cval;
                                        curr_lev = (tree[curr_lev].cat_split[cval])?
                                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                        break;
                                    }

                                    case Smallest:
                                    {
                                        if (unlikely(cval >= (int)tree[curr_lev].cat_split.size()))
                                        {
                                            curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                        }

                                        else
                                        {
                                            curr_lev = (tree[curr_lev].cat_split[cval])?
                                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                        }
                                        break;
                                    }

                                    default:
                                    {
                                        assert(0);
                                        break;
                                    }
                                }
                            }
                            break;
                        }

                        case SingleCateg:
                        {
                            curr_lev = (cval == tree[curr_lev].chosen_cat)?
                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                            break;
                        }
                    }
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }
}